

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::Reader::getLocationLineAndColumn(Reader *this,Location location,int *line,int *column)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar3 = this->begin_;
  *line = 0;
  if ((pcVar3 < location) && (pcVar3 != this->end_)) {
    iVar2 = 0;
    pcVar5 = pcVar3;
    do {
      pcVar1 = pcVar3 + 1;
      if (*pcVar3 == '\n') {
LAB_001c5e0a:
        pcVar5 = pcVar1;
        iVar2 = iVar2 + 1;
        *line = iVar2;
        pcVar1 = pcVar5;
      }
      else if (*pcVar3 == '\r') {
        if (pcVar3[1] == '\n') {
          pcVar1 = pcVar3 + 2;
        }
        goto LAB_001c5e0a;
      }
      pcVar3 = pcVar1;
      iVar4 = (int)pcVar5;
    } while ((pcVar3 < location) && (pcVar3 != this->end_));
  }
  else {
    iVar4 = (int)pcVar3;
  }
  *column = ((int)location - iVar4) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void
Reader::getLocationLineAndColumn ( Location location,
                                   int& line,
                                   int& column ) const
{
    Location current = begin_;
    Location lastLineStart = current;
    line = 0;

    while ( current < location  &&  current != end_ )
    {
        Char c = *current++;

        if ( c == '\r' )
        {
            if ( *current == '\n' )
                ++current;

            lastLineStart = current;
            ++line;
        }
        else if ( c == '\n' )
        {
            lastLineStart = current;
            ++line;
        }
    }

    // column & line start at 1
    column = int (location - lastLineStart) + 1;
    ++line;
}